

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

ON_DimStyle * __thiscall
ON_DimStyle::CreateOverrideCandidate(ON_DimStyle *__return_storage_ptr__,ON_DimStyle *this)

{
  ON_UUID parent_id_00;
  ON_UUID id;
  bool bVar1;
  ON_UUID *pOVar2;
  ON_DimStyle *parent;
  ON_UUID *local_c0;
  ON_DimStyle *system_parent;
  ON_UUID parent_id;
  ON_DimStyle *this_local;
  ON_DimStyle *override_candidate;
  
  ON_DimStyle(__return_storage_ptr__,this);
  pOVar2 = ON_ModelComponent::ParentId(&this->super_ON_ModelComponent);
  bVar1 = IsOverrideDimStyleCandidate(this,*pOVar2,false,(ON_wString *)0x0);
  if (!bVar1) {
    bVar1 = ON_ModelComponent::ParentIdIsNotNil(&__return_storage_ptr__->super_ON_ModelComponent);
    if (bVar1) {
      local_c0 = ON_ModelComponent::ParentId(&__return_storage_ptr__->super_ON_ModelComponent);
    }
    else {
      local_c0 = ON_ModelComponent::Id(&__return_storage_ptr__->super_ON_ModelComponent);
    }
    system_parent = *(ON_DimStyle **)local_c0;
    parent_id._0_8_ = *(undefined8 *)local_c0->Data4;
    ON_ModelComponent::ClearId(&__return_storage_ptr__->super_ON_ModelComponent);
    ON_ModelComponent::ClearName(&__return_storage_ptr__->super_ON_ModelComponent);
    ON_ModelComponent::ClearIndex(&__return_storage_ptr__->super_ON_ModelComponent);
    bVar1 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)&system_parent);
    if (bVar1) {
      pOVar2 = ON_ModelComponent::Id(&Default.super_ON_ModelComponent);
      system_parent = *(ON_DimStyle **)pOVar2;
      parent_id._0_8_ = *(undefined8 *)pOVar2->Data4;
    }
    ON_ModelComponent::SetParentId
              (&__return_storage_ptr__->super_ON_ModelComponent,(ON_UUID *)&system_parent);
    bVar1 = HasOverrides(__return_storage_ptr__);
    if (bVar1) {
      id.Data4 = (uchar  [8])parent_id._0_8_;
      id._0_8_ = system_parent;
      parent = SystemDimstyleFromId(id);
      pOVar2 = ON_ModelComponent::Id(&parent->super_ON_ModelComponent);
      bVar1 = ::operator==(pOVar2,(ON_UUID_struct *)&system_parent);
      if (bVar1) {
        OverrideFields(__return_storage_ptr__,__return_storage_ptr__,parent);
      }
    }
    parent_id_00.Data4 = (uchar  [8])parent_id._0_8_;
    parent_id_00._0_8_ = system_parent;
    bVar1 = IsOverrideDimStyleCandidate(__return_storage_ptr__,parent_id_00,false,(ON_wString *)0x0)
    ;
    if (!bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
                 ,0x14fa,"","Failed to create valid override candidate.");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_DimStyle ON_DimStyle::CreateOverrideCandidate() const
{
  ON_DimStyle override_candidate(*this);
  
  // NOTE:
  // parent_id can be nil. This allows a default constructed dimstyle to be
  // used as an override candidate.
  if ( this->IsOverrideDimStyleCandidate(ParentId(), false))
    return override_candidate;

  ON_UUID parent_id
    = override_candidate.ParentIdIsNotNil()
    ? override_candidate.ParentId()
    : override_candidate.Id();

  override_candidate.ClearId();
  override_candidate.ClearName();
  override_candidate.ClearIndex();

  if (ON_nil_uuid == parent_id)
  {
    parent_id = ON_DimStyle::Default.Id();
  }
  
  override_candidate.SetParentId(parent_id);

  if (override_candidate.HasOverrides())
  {
    const ON_DimStyle& system_parent = ON_DimStyle::SystemDimstyleFromId(parent_id);
    if (system_parent.Id() == parent_id)
      override_candidate.OverrideFields(override_candidate, system_parent);
  }

  if (false == override_candidate.IsOverrideDimStyleCandidate(parent_id, false))
  {
    ON_ERROR("Failed to create valid override candidate.");
  }

  return override_candidate;  
}